

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::doWalkFunction(I64ToI32Lowering *this,Function *func)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  Module *pMVar1;
  pointer pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  Index IVar6;
  Builder *pBVar7;
  Function *func_00;
  size_t sVar8;
  wasm *this_01;
  Type TVar9;
  mapped_type *pmVar10;
  size_t in_RCX;
  uint uVar11;
  uchar *in_R8;
  size_t in_R9;
  mapped_type mVar12;
  code *pcVar13;
  Signature SVar14;
  Name NVar15;
  Name NVar16;
  undefined1 auStack_3c8 [8];
  Module temp;
  size_t local_78;
  char *local_70;
  HeapType local_38;
  
  auStack_3c8 = (undefined1  [8])0x0;
  temp.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.tables.
  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  temp.start.super_IString.str._M_str = (char *)0x0;
  temp.start.super_IString.str._M_len = (size_t)func;
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::walk
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             auStack_3c8,&func->body);
  temp.start.super_IString.str._M_len = (size_t)func;
  Flat::anon_func::VerifyFlatness::verify
            ((VerifyFlatness *)auStack_3c8,(EVP_PKEY_CTX *)(ulong)((func->body->type).id < 2),
             (uchar *)"function bodies must not flow values",in_RCX,in_R8,in_R9);
  if (temp.tables.
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp.tables.
                    super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)temp.tables.
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)temp.tables.
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule;
    pBVar7 = (Builder *)operator_new(8);
    pBVar7->wasm = pMVar1;
    (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = pBVar7;
  }
  this_00 = &this->indexMap;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->highBitVars)._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->freeTemps)._M_h);
  Module::Module((Module *)auStack_3c8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R8;
  func_00 = wasm::ModuleUtils::copyFunction
                      ((ModuleUtils *)func,(Function *)auStack_3c8,(Module *)0x0,
                       (Name)(auVar3 << 0x40));
  SVar14 = HeapType::getSignature(&func->type);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar14.results.id.id;
  HeapType::HeapType(&local_38,(Signature)(auVar4 << 0x40));
  (func->type).id = CONCAT44(local_38.id._4_4_,(uint)local_38.id);
  pTVar2 = (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar2) {
    (func->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(func->localNames)._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(func->localIndices)._M_h);
  Names::ensureNames(func_00);
  uVar11 = 0;
  mVar12 = 0;
  while( true ) {
    local_38.id._0_4_ = uVar11;
    sVar8 = Function::getNumLocals(func_00);
    if (sVar8 <= uVar11) {
      sVar8 = Function::getNumLocals(func);
      this->nextTemp = (Index)sVar8;
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::walk
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,&func->body);
      Module::~Module((Module *)auStack_3c8);
      return;
    }
    bVar5 = Function::hasLocalName(func_00,(uint)local_38.id);
    if (!bVar5) break;
    NVar15 = Function::getLocalName(func_00,(uint)local_38.id);
    this_01 = NVar15.super_IString.str._M_len;
    NVar15.super_IString.str._M_len = (size_t)NVar15.super_IString.str._M_str;
    NVar16 = makeHighName(this_01,NVar15);
    TVar9 = Function::getLocalType(func_00,(uint)local_38.id);
    uVar11 = (uint)local_38.id;
    IVar6 = Function::getVarIndexBase(func_00);
    pcVar13 = Builder::addVar;
    if (uVar11 < IVar6) {
      pcVar13 = Builder::addParam;
    }
    if (TVar9.id == 3) {
      (*pcVar13)(func,this_01,NVar15.super_IString.str._M_str,2);
      local_78 = NVar16.super_IString.str._M_len;
      local_70 = NVar16.super_IString.str._M_str;
      (*pcVar13)(func,local_78,local_70,2);
      pmVar10 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)&local_38);
      *pmVar10 = mVar12;
      mVar12 = mVar12 + 2;
    }
    else {
      (*pcVar13)(func,this_01,NVar15.super_IString.str._M_str,TVar9.id);
      pmVar10 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_00,(key_type *)&local_38);
      *pmVar10 = mVar12;
      mVar12 = mVar12 + 1;
    }
    uVar11 = (uint)local_38.id + 1;
  }
  __assert_fail("oldFunc->hasLocalName(i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0xab,"void wasm::I64ToI32Lowering::doWalkFunction(Function *)");
}

Assistant:

void doWalkFunction(Function* func) {
    Flat::verifyFlatness(func);
    // create builder here if this is first entry to module for this object
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    indexMap.clear();
    highBitVars.clear();
    freeTemps.clear();
    Module temp;
    auto* oldFunc = ModuleUtils::copyFunction(func, temp);
    func->setParams(Type::none);
    func->vars.clear();
    func->localNames.clear();
    func->localIndices.clear();
    Index newIdx = 0;
    Names::ensureNames(oldFunc);
    for (Index i = 0; i < oldFunc->getNumLocals(); ++i) {
      assert(oldFunc->hasLocalName(i));
      Name lowName = oldFunc->getLocalName(i);
      Name highName = makeHighName(lowName);
      Type paramType = oldFunc->getLocalType(i);
      auto builderFunc =
        (i < oldFunc->getVarIndexBase())
          ? Builder::addParam
          : static_cast<Index (*)(Function*, Name, Type)>(Builder::addVar);
      if (paramType == Type::i64) {
        builderFunc(func, lowName, Type::i32);
        builderFunc(func, highName, Type::i32);
        indexMap[i] = newIdx;
        newIdx += 2;
      } else {
        builderFunc(func, lowName, paramType);
        indexMap[i] = newIdx++;
      }
    }
    nextTemp = func->getNumLocals();
    PostWalker<I64ToI32Lowering>::doWalkFunction(func);
  }